

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio.h
# Opt level: O1

void __thiscall
lossless_neural_sound::audio::File_input_stream::File_input_stream
          (File_input_stream *this,char *file_name)

{
  ifstream *this_00;
  long lVar1;
  system_error *this_01;
  error_category *peVar2;
  error_code __ec;
  
  (this->super_Rewindable_input_stream).super_Input_stream._vptr_Input_stream =
       (_func_int **)&PTR__File_input_stream_00105cc8;
  this_00 = &this->is;
  std::ifstream::ifstream(this_00);
  lVar1 = (long)&(this->super_Rewindable_input_stream).super_Input_stream._vptr_Input_stream +
          *(long *)(*(long *)&this->is + -0x18);
  *(undefined4 *)(lVar1 + 0x24) = 1;
  std::ios::clear((int)lVar1 + 8);
  std::ifstream::open((char *)this_00,(_Ios_Openmode)file_name);
  if (((&this->field_0x28)[*(long *)(*(long *)this_00 + -0x18)] & 5) == 0) {
    return;
  }
  this_01 = (system_error *)__cxa_allocate_exception(0x20);
  peVar2 = (error_category *)std::_V2::generic_category();
  __ec._M_cat = peVar2;
  __ec._0_8_ = 2;
  std::system_error::system_error(this_01,__ec,"open failed");
  *(undefined ***)this_01 = &PTR__system_error_00105d10;
  __cxa_throw(this_01,&Audio_error::typeinfo,std::system_error::~system_error);
}

Assistant:

explicit File_input_stream(const char *file_name) : is()
    {
        is.exceptions(std::ios::badbit);
        is.open(file_name, std::ios::binary);
        if(!is)
            throw Audio_error(make_error_code(std::errc::no_such_file_or_directory), "open failed");
    }